

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.h
# Opt level: O1

void __thiscall
capnp::RpcSystem<capnproto_test::capnp::test::TestSturdyRefHostId>::
RpcSystem<capnproto_test::capnp::test::TestThirdPartyCompletion,capnproto_test::capnp::test::TestThirdPartyToAwait,capnproto_test::capnp::test::TestThirdPartyToContact,capnproto_test::capnp::test::TestJoinResult>
          (RpcSystem<capnproto_test::capnp::test::TestSturdyRefHostId> *this,
          VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>
          *network,Maybe<capnp::Capability::Client> *bootstrap)

{
  undefined8 uVar1;
  Maybe<capnp::Capability::Client> local_30;
  
  kj::Maybe<capnp::Capability::Client>::Maybe(&local_30,bootstrap);
  capnp::_::RpcSystemBase::RpcSystemBase
            (&this->super_RpcSystemBase,&network->super_VatNetworkBase,&local_30);
  uVar1 = local_30.ptr.field_1.value.hook.ptr;
  if ((local_30.ptr.isSet == true) && (local_30.ptr.field_1.value.hook.ptr != (ClientHook *)0x0)) {
    local_30.ptr.field_1.value.hook.ptr = (ClientHook *)0x0;
    (**(local_30.ptr.field_1.value.hook.disposer)->_vptr_Disposer)
              (local_30.ptr.field_1.value.hook.disposer,
               (_func_int *)
               ((long)&((ClientHook *)uVar1)->_vptr_ClientHook +
               (long)((ClientHook *)uVar1)->_vptr_ClientHook[-2]));
  }
  return;
}

Assistant:

RpcSystem<VatId>::RpcSystem(
      VatNetwork<VatId, ThirdPartyCompletion, ThirdPartyToAwait, ThirdPartyToContact,
                 JoinResult>& network,
      kj::Maybe<Capability::Client> bootstrap)
    : _::RpcSystemBase(network, kj::mv(bootstrap)) {}